

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

compressed_lower_distance_matrix *
read_dipha(compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  double dVar1;
  compressed_lower_distance_matrix *pcVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  int j;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  float local_54;
  compressed_lower_distance_matrix *local_50;
  vector<float,_std::allocator<float>_> distances;
  
  lVar4 = read<long>(input_stream);
  if (lVar4 == 0x1e0d74600) {
    local_50 = __return_storage_ptr__;
    lVar4 = read<long>(input_stream);
    if (lVar4 == 7) {
      lVar4 = read<long>(input_stream);
      distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar7 = 0;
      uVar9 = (uint)lVar4;
      uVar3 = 0;
      if (0 < (int)uVar9) {
        uVar3 = uVar9;
      }
      for (; pcVar2 = local_50, uVar7 != uVar3; uVar7 = uVar7 + 1) {
        for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
          if (uVar6 < uVar7) {
            dVar1 = read<double>(input_stream);
            local_54 = (float)dVar1;
            std::vector<float,_std::allocator<float>_>::emplace_back<float>(&distances,&local_54);
          }
          else {
            read<double>(input_stream);
          }
        }
      }
      compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
                (local_50,&distances);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&distances.super__Vector_base<float,_std::allocator<float>_>);
      return pcVar2;
    }
    pcVar8 = "input is not a Dipha distance matrix (file type: 7)";
  }
  else {
    pcVar8 = "input is not a Dipha file (magic number: 8067171840)";
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(-1);
}

Assistant:

compressed_lower_distance_matrix read_dipha(std::istream& input_stream) {
	if (read<int64_t>(input_stream) != 8067171840) {
		std::cerr << "input is not a Dipha file (magic number: 8067171840)" << std::endl;
		exit(-1);
	}

	if (read<int64_t>(input_stream) != 7) {
		std::cerr << "input is not a Dipha distance matrix (file type: 7)" << std::endl;
		exit(-1);
	}

	index_t n = index_t(read<int64_t>(input_stream));

	std::vector<value_t> distances;

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			if (i > j)
				distances.push_back(value_t(read<double>(input_stream)));
			else
				read<double>(input_stream);

	return compressed_lower_distance_matrix(std::move(distances));
}